

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

void player_take_terrain_damage(player *p,loc grid)

{
  _Bool _Var1;
  wchar_t dam;
  wchar_t dam_00;
  feature *pfVar2;
  char dam_text [32];
  
  dam = player_check_terrain_damage(p,grid,true);
  if (dam != L'\0') {
    dam_00 = player_apply_damage_reduction(p,dam);
    _Var1 = square_isfiery(cave,grid);
    if (_Var1) {
      dam_text[0x10] = '\0';
      dam_text[0x11] = '\0';
      dam_text[0x12] = '\0';
      dam_text[0x13] = '\0';
      dam_text[0x14] = '\0';
      dam_text[0x15] = '\0';
      dam_text[0x16] = '\0';
      dam_text[0x17] = '\0';
      dam_text[0x18] = '\0';
      dam_text[0x19] = '\0';
      dam_text[0x1a] = '\0';
      dam_text[0x1b] = '\0';
      dam_text[0x1c] = '\0';
      dam_text[0x1d] = '\0';
      dam_text[0x1e] = '\0';
      dam_text[0x1f] = '\0';
      dam_text[0] = '\0';
      dam_text[1] = '\0';
      dam_text[2] = '\0';
      dam_text[3] = '\0';
      dam_text[4] = '\0';
      dam_text[5] = '\0';
      dam_text[6] = '\0';
      dam_text[7] = '\0';
      dam_text[8] = '\0';
      dam_text[9] = '\0';
      dam_text[10] = '\0';
      dam_text[0xb] = '\0';
      dam_text[0xc] = '\0';
      dam_text[0xd] = '\0';
      dam_text[0xe] = '\0';
      dam_text[0xf] = '\0';
      if ((L'\0' < dam_00) && ((p->opts).opt[3] == true)) {
        strnfmt(dam_text,0x20," (%d)",(ulong)(uint)dam_00);
      }
      pfVar2 = square_feat(cave,grid);
      msg("%s%s",pfVar2->hurt_msg,dam_text);
      inven_damage(p,L'\x02',dam);
    }
    pfVar2 = square_feat(cave,grid);
    take_hit(p,dam_00,pfVar2->die_msg);
  }
  return;
}

Assistant:

void player_take_terrain_damage(struct player *p, struct loc grid)
{
	int dam_taken = player_check_terrain_damage(p, grid, true);
	int dam_reduced;

	if (!dam_taken) {
		return;
	}

	/*
	 * Damage the player and inventory; inventory damage is based on
	 * the raw incoming damage and not the value accounting for the
	 * player's damage reduction.
	 */
	dam_reduced = player_apply_damage_reduction(p, dam_taken);
	if (square_isfiery(cave, grid)) {
		char dam_text[32] = "";

		if (dam_reduced > 0 && OPT(p, show_damage)) {
			strnfmt(dam_text, sizeof(dam_text), " (%d)",
				dam_reduced);
		}
		msg("%s%s", square_feat(cave, grid)->hurt_msg, dam_text);
		inven_damage(p, PROJ_FIRE, dam_taken);
	}
	take_hit(p, dam_reduced, square_feat(cave, grid)->die_msg);
}